

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall camp::FunctionNotFound::~FunctionNotFound(FunctionNotFound *this)

{
  FunctionNotFound *this_local;
  
  ~FunctionNotFound(this);
  operator_delete(this);
  return;
}

Assistant:

class CAMP_API FunctionNotFound : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param name Name of the requested function
     * \param className Name of the owner metaclass
     */
    FunctionNotFound(const std::string& name, const std::string& className);
}